

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::CompilerMain(CompilerMain *this,ProcessContext *context)

{
  (this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = (_func_int **)&PTR_addError_00272248
  ;
  this->context = context;
  kj::newDiskFilesystem();
  ModuleLoader::ModuleLoader(&this->loader,&this->super_GlobalErrorReporter);
  this->compilerConstructed = false;
  (this->compiler).disposer = (Disposer *)0x0;
  (this->compiler).ptr = (Compiler *)0x0;
  this->annotationFlag = COMPILE_ANNOTATIONS;
  this->compileEagerness = 0x18005;
  (this->sourceDirectories).table.rows.builder.endPtr = (Entry *)0x0;
  (this->sourceDirectories).table.rows.builder.ptr = (Entry *)0x0;
  (this->sourceDirectories).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry> *)
       0x0;
  (this->sourceDirectories).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->sourceDirectories).table.indexes.erasedCount = 0;
  (this->sourceDirectories).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->sourceDirectories).table.indexes.buckets.size_ = 0;
  (this->sourceDirectories).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->dirPrefixes).table.rows.builder.endPtr = (Entry *)0x0;
  (this->dirPrefixes).table.rows.builder.ptr = (Entry *)0x0;
  (this->dirPrefixes).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *)0x0;
  (this->dirPrefixes).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->dirPrefixes).table.indexes.erasedCount = 0;
  (this->dirPrefixes).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->dirPrefixes).table.indexes.buckets.size_ = 0;
  (this->dirPrefixes).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  this->addStandardImportPaths = true;
  *(undefined4 *)((long)&this->convertTo + 3) = 0;
  this->convertFrom = BINARY;
  this->convertTo = BINARY;
  this->pretty = true;
  this->quiet = false;
  this->segmentSize = 0;
  (this->rootType).super_Schema.raw = (RawBrandedSchema *)0x277878;
  (this->sourceFiles).builder.ptr = (SourceFile *)0x0;
  (this->sourceFiles).builder.pos = (RemoveConst<capnp::compiler::CompilerMain::SourceFile> *)0x0;
  (this->sourceFiles).builder.endPtr = (SourceFile *)0x0;
  (this->sourceFiles).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->outputs).builder.endPtr = (OutputDirective *)0x0;
  (this->outputs).builder.ptr = (OutputDirective *)0x0;
  (this->outputs).builder.pos = (RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *)0x0;
  (this->outputs).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  this->hadErrors_ = false;
  return;
}

Assistant:

explicit CompilerMain(kj::ProcessContext& context)
      : context(context), disk(kj::newDiskFilesystem()), loader(*this) {}